

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

BlockDataStruct * __thiscall
cfd::js::api::json::BlockData::ConvertToStruct
          (BlockDataStruct *__return_storage_ptr__,BlockData *this)

{
  BlockData *this_local;
  BlockDataStruct *result;
  
  BlockDataStruct::BlockDataStruct(__return_storage_ptr__);
  __return_storage_ptr__->is_elements = (bool)(this->is_elements_ & 1);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->block,(string *)&this->block_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

BlockDataStruct BlockData::ConvertToStruct() const {  // NOLINT
  BlockDataStruct result;
  result.is_elements = is_elements_;
  result.block = block_;
  result.ignore_items = ignore_items;
  return result;
}